

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getcoluj.c
# Opt level: O1

int ffgpfuj(fitsfile *fptr,long group,LONGLONG firstelem,LONGLONG nelem,unsigned_long *array,
           char *nularray,int *anynul,int *status)

{
  int iVar1;
  
  iVar1 = fits_is_compressed_image(fptr,status);
  if (iVar1 == 0) {
    if (group < 2) {
      group = 1;
    }
    ffgcluj(fptr,2,group,firstelem,nelem,1,2,0,array,nularray,anynul,status);
  }
  else {
    fits_read_compressed_pixels
              (fptr,0x28,firstelem,nelem,2,(void *)0x0,array,nularray,anynul,status);
  }
  return *status;
}

Assistant:

int ffgpfuj(fitsfile *fptr,   /* I - FITS file pointer                       */
            long  group,      /* I - group to read (1 = 1st group)           */
            LONGLONG  firstelem,  /* I - first vector element to read (1 = 1st)  */
            LONGLONG  nelem,      /* I - number of values to read                */
   unsigned long  *array,     /* O - array of values that are returned       */
            char *nularray,   /* O - array of null pixel flags               */
            int  *anynul,     /* O - set to 1 if any values are null; else 0 */
            int  *status)     /* IO - error status                           */
/*
  Read an array of values from the primary array. Data conversion
  and scaling will be performed if necessary (e.g, if the datatype of
  the FITS array is not the same as the array being read).
  Any undefined pixels in the returned array will be set = 0 and the 
  corresponding nularray value will be set = 1.
  ANYNUL is returned with a value of .true. if any pixels are undefined.
*/
{
    long row;
    int nullcheck = 2;

    if (fits_is_compressed_image(fptr, status))
    {
        /* this is a compressed image in a binary table */

        fits_read_compressed_pixels(fptr, TULONG, firstelem, nelem,
            nullcheck, NULL, array, nularray, anynul, status);
        return(*status);
    }

    /*
      the primary array is represented as a binary table:
      each group of the primary array is a row in the table,
      where the first column contains the group parameters
      and the second column contains the image itself.
    */

    row=maxvalue(1,group);

    ffgcluj(fptr, 2, row, firstelem, nelem, 1, 2, 0L,
               array, nularray, anynul, status);
    return(*status);
}